

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_app.cpp
# Opt level: O2

int __thiscall Clasp::Cli::ClaspAppBase::shutdown(ClaspAppBase *this,int __fd,int __how)

{
  int in_EAX;
  int iVar1;
  uint uVar2;
  uint uVar3;
  int extraout_EAX;
  undefined4 extraout_var;
  StringBuilder *this_00;
  char *pcVar4;
  int __how_00;
  LemmaLogger *this_01;
  long *plVar5;
  ClaspAppBase *this_02;
  double dVar6;
  StringBuilder local_60;
  
  if (1 < (this->clasp_).ptr_) {
    this_01 = (LemmaLogger *)((this->logger_).ptr_ & 0xfffffffffffffffe);
    if (this_01 != (LemmaLogger *)0x0) {
      LemmaLogger::close(this_01,__fd);
    }
    iVar1 = 0;
    SingleOwnerPtr<Potassco::ProgramReader,_Clasp::DeleteObject>::reset
              (&this->lemmaIn_,(ProgramReader *)0x0);
    iVar1 = ClaspFacade::shutdown
                      ((ClaspFacade *)((this->clasp_).ptr_ & 0xfffffffffffffffe),iVar1,__how_00);
    if ((shutdownTime_g != 0.0) || (NAN(shutdownTime_g))) {
      dVar6 = RealTime::getTime();
      shutdownTime_g = dVar6 + shutdownTime_g;
      Potassco::StringBuilder::StringBuilder(&local_60);
      this_00 = Potassco::StringBuilder::appendFormat
                          (&local_60,"Shutdown completed in %.3f seconds",shutdownTime_g);
      pcVar4 = Potassco::StringBuilder::c_str(this_00);
      (*(this->super_Application)._vptr_Application[7])(this,pcVar4);
      Potassco::StringBuilder::~StringBuilder(&local_60);
    }
    plVar5 = (long *)((this->out_).ptr_ & 0xfffffffffffffffe);
    if (plVar5 != (long *)0x0) {
      (**(code **)(*plVar5 + 0x30))(plVar5,(RunSummary *)CONCAT44(extraout_var,iVar1));
    }
    this_02 = this;
    uVar2 = Potassco::Application::getExitCode(&this->super_Application);
    uVar3 = exitCode(this_02,(RunSummary *)CONCAT44(extraout_var,iVar1));
    Potassco::Application::setExitCode(&this->super_Application,uVar2 | uVar3);
    in_EAX = extraout_EAX;
  }
  return in_EAX;
}

Assistant:

void ClaspAppBase::shutdown() {
	if (!clasp_.get()) { return; }
	if (logger_.get()) { logger_->close(); }
	lemmaIn_ = 0;
	const ClaspFacade::Summary& result = clasp_->shutdown();
	if (shutdownTime_g) {
		shutdownTime_g += RealTime::getTime();
		info(POTASSCO_FORMAT("Shutdown completed in %.3f seconds", shutdownTime_g));
	}
	if (out_.get())  { out_->shutdown(result); }
	setExitCode(getExitCode() | exitCode(result));
	if (setFpuMode()){ fpuReset(fpuMode_); }
}